

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configparser.h
# Opt level: O2

void __thiscall phyr::ConfigArgsList::addParam<int>(ConfigArgsList *this,Param<int> *p)

{
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<phyr::ParamAbstract> local_28;
  
  std::make_shared<phyr::Param<int>,int_const&,phyr::ParamType_const&>
            ((int *)&local_38,(ParamType *)&p->value);
  local_28.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  local_28.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_30._M_pi;
  local_38 = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<phyr::ParamAbstract>,std::allocator<std::shared_ptr<phyr::ParamAbstract>>>
  ::emplace_back<std::shared_ptr<phyr::ParamAbstract>>
            ((vector<std::shared_ptr<phyr::ParamAbstract>,std::allocator<std::shared_ptr<phyr::ParamAbstract>>>
              *)this,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  return;
}

Assistant:

void addParam(const Param<U>& p) {
        ASSERT(idx < nArgs);
        argList.push_back(std::make_shared<Param<U>>(p.value, p.type));
    }